

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

QRectF * __thiscall QGraphicsView::sceneRect(QRectF *__return_storage_ptr__,QGraphicsView *this)

{
  long lVar1;
  qreal qVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  
  lVar1 = *(long *)(this + 8);
  if ((*(byte *)(lVar1 + 0x300) & 2) == 0) {
    bVar3 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x490));
    if (bVar3) {
      QGraphicsScene::sceneRect(__return_storage_ptr__,*(QGraphicsScene **)(lVar1 + 0x498));
      return __return_storage_ptr__;
    }
    uVar4 = 0;
    uVar5 = 0;
    uVar6 = 0;
    uVar7 = 0;
    __return_storage_ptr__->w = 0.0;
    __return_storage_ptr__->h = 0.0;
  }
  else {
    uVar4 = *(undefined4 *)(lVar1 + 0x308);
    uVar5 = *(undefined4 *)(lVar1 + 0x30c);
    uVar6 = *(undefined4 *)(lVar1 + 0x310);
    uVar7 = *(undefined4 *)(lVar1 + 0x314);
    qVar2 = *(qreal *)(lVar1 + 800);
    __return_storage_ptr__->w = *(qreal *)(lVar1 + 0x318);
    __return_storage_ptr__->h = qVar2;
  }
  *(undefined4 *)&__return_storage_ptr__->xp = uVar4;
  *(undefined4 *)((long)&__return_storage_ptr__->xp + 4) = uVar5;
  *(undefined4 *)&__return_storage_ptr__->yp = uVar6;
  *(undefined4 *)((long)&__return_storage_ptr__->yp + 4) = uVar7;
  return __return_storage_ptr__;
}

Assistant:

QRectF QGraphicsView::sceneRect() const
{
    Q_D(const QGraphicsView);
    if (d->hasSceneRect)
        return d->sceneRect;
    if (d->scene)
        return d->scene->sceneRect();
    return QRectF();
}